

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

bool __thiscall
testing::internal::TypedTestSuitePState::AddTestName
          (TypedTestSuitePState *this,char *file,int line,char *case_name,char *test_name)

{
  FILE *__stream;
  undefined8 uVar1;
  allocator<char> local_99;
  string local_98;
  CodeLocation local_78;
  string local_50;
  char *local_30;
  char *test_name_local;
  char *case_name_local;
  char *pcStack_18;
  int line_local;
  char *file_local;
  TypedTestSuitePState *this_local;
  
  __stream = _stderr;
  local_30 = test_name;
  test_name_local = case_name;
  case_name_local._4_4_ = line;
  pcStack_18 = file;
  file_local = &this->registered_;
  if ((this->registered_ & 1U) != 0) {
    FormatFileLocation_abi_cxx11_
              (&local_50,(internal *)file,(char *)(ulong)(uint)line,(int)case_name);
    uVar1 = std::__cxx11::string::c_str();
    fprintf(__stream,"%s Test %s must be defined before REGISTER_TYPED_TEST_SUITE_P(%s, ...).\n",
            uVar1,local_30,test_name_local);
    std::__cxx11::string::~string((string *)&local_50);
    fflush(_stderr);
    posix::Abort();
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,file,&local_99);
  CodeLocation::CodeLocation(&local_78,&local_98,case_name_local._4_4_);
  std::
  map<std::__cxx11::string,testing::internal::CodeLocation,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,testing::internal::CodeLocation>>>
  ::emplace<char_const*&,testing::internal::CodeLocation>
            ((map<std::__cxx11::string,testing::internal::CodeLocation,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,testing::internal::CodeLocation>>>
              *)&this->registered_tests_,&local_30,&local_78);
  CodeLocation::~CodeLocation(&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  return true;
}

Assistant:

bool AddTestName(const char* file, int line, const char* case_name,
                   const char* test_name) {
    if (registered_) {
      fprintf(stderr,
              "%s Test %s must be defined before "
              "REGISTER_TYPED_TEST_SUITE_P(%s, ...).\n",
              FormatFileLocation(file, line).c_str(), test_name, case_name);
      fflush(stderr);
      posix::Abort();
    }
    registered_tests_.emplace(test_name, CodeLocation(file, line));
    return true;
  }